

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

allocator_type * __thiscall
VectorInstance::op_sliceFromIndex_toIndex
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  size_type sVar2;
  undefined8 *puVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *in_RSI;
  allocator_type *in_RDI;
  int to_index;
  int from_index;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_fffffffffffffe88;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *__n;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  *in_stack_fffffffffffffe98;
  int iVar4;
  int iVar5;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  IntegerInstance *in_stack_fffffffffffffee0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff28;
  IntegerInstance local_80;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 2) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  IntegerInstance::IntegerInstance(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  iVar1 = IntegerInstance::value(&local_80);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1c00d2);
  local_1c = iVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,1);
  IntegerInstance::IntegerInstance(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  iVar1 = IntegerInstance::value((IntegerInstance *)&stack0xffffffffffffff18);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1c011d);
  if (-1 < local_1c) {
    iVar5 = local_1c;
    sVar2 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
            size(in_RSI + 5);
    if (iVar5 <= (int)sVar2) {
      if (-1 < iVar1) {
        iVar4 = iVar1;
        sVar2 = std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                ::size(in_RSI + 5);
        if (iVar4 <= (int)sVar2) {
          if (iVar1 - local_1c < 0) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = "RuntimeError: invalid argument.";
            __cxa_throw(puVar3,&char_const*::typeinfo,0);
          }
          __n = in_RSI + 5;
          std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                    (in_stack_fffffffffffffe88);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
          ::operator+(in_stack_fffffffffffffe98,(difference_type)__n);
          std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                    (in_stack_fffffffffffffe88);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
          ::operator+(in_stack_fffffffffffffe98,(difference_type)__n);
          std::allocator<std::shared_ptr<Instance>_>::allocator
                    ((allocator<std::shared_ptr<Instance>_> *)0x1c0270);
          std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>::
          vector<__gnu_cxx::__normal_iterator<std::shared_ptr<Instance>*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>,void>
                    (in_RSI,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_RDI);
          vector_representation_abi_cxx11_
                    ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                      *)in_stack_ffffffffffffff28._M_pi);
          std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
          ~vector((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                  CONCAT44(iVar5,iVar4));
          std::allocator<std::shared_ptr<Instance>_>::~allocator
                    ((allocator<std::shared_ptr<Instance>_> *)0x1c02b0);
          return in_RDI;
        }
      }
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "RuntimeError: invalid argument.";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_sliceFromIndex_toIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int from_index = IntegerInstance(arguments[0]).value();
    int to_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index < 0 || to_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    if (to_index - from_index < 0)
        throw EXC_INVALID_ARGUMENT;
    return vector_representation(std::vector<std::shared_ptr<Instance>>(_value.begin() + from_index,
                                                                        _value.begin() + to_index));
}